

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calcdb.cc
# Opt level: O1

int __thiscall DbaseCtrlBlk::init(DbaseCtrlBlk *this,EVP_PKEY_CTX *ctx)

{
  int __fd;
  int *piVar1;
  unsigned_long uVar2;
  runtime_error *this_00;
  int in_EDX;
  ulong uVar3;
  
  __fd = open(*(char **)ctx,0);
  this->fd = __fd;
  if (-1 < __fd) {
    this->buf_size = in_EDX;
    uVar3 = 0xffffffffffffffff;
    if (-1 < in_EDX) {
      uVar3 = (long)in_EDX * 4;
    }
    piVar1 = (int *)operator_new__(uVar3);
    this->buf = piVar1;
    this->cur_buf_pos = 0;
    this->cur_blk_size = 0;
    this->readall = '\0';
    uVar2 = lseek(__fd,0,2);
    this->endpos = uVar2;
    return (int)uVar2;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"ERROR: InvalidFile -- Dbase_Ctrl_Blk()");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void DbaseCtrlBlk::init(const string &infilename, int buf_sz) {
    fd = open(infilename.c_str(), O_RDONLY | O_BINARY);
    if (fd < 0) {
        throw runtime_error("ERROR: InvalidFile -- Dbase_Ctrl_Blk()");
    }

    buf_size = buf_sz;
    buf = new int[buf_sz];
    cur_buf_pos = 0;
    cur_blk_size = 0;
    readall = 0;
    endpos = lseek(fd, 0, SEEK_END);
}